

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLParam<double>::~CLParam(CLParam<double> *this)

{
  CLParam<double> *in_RDI;
  
  ~CLParam(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~CLParam() {}